

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintHelpOneManual(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  cmDocumentation *pcVar4;
  string mname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_a0,(string *)&this->CurrentArgument);
  if (((3 < local_a0._M_string_length) &&
      (local_a0._M_dataplus._M_p[local_a0._M_string_length - 3] == '(')) &&
     (local_a0._M_dataplus._M_p[local_a0._M_string_length - 1] == ')')) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   &local_40,".");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   local_a0._M_dataplus._M_p[local_a0._M_string_length - 2]);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  pcVar4 = (cmDocumentation *)local_60;
  cmStrCat<char_const(&)[8],std::__cxx11::string&>
            ((string *)pcVar4,(char (*) [8])"manual/",&local_a0);
  bVar1 = PrintFiles(pcVar4,os,(string *)local_60);
  bVar2 = true;
  if (!bVar1) {
    pcVar4 = (cmDocumentation *)local_80;
    cmStrCat<char_const(&)[8],std::__cxx11::string&,char_const(&)[7]>
              ((string *)pcVar4,(char (*) [8])"manual/",&local_a0,(char (*) [7])".[0-9]");
    bVar2 = PrintFiles(pcVar4,os,(string *)local_80);
    std::__cxx11::string::~string((string *)local_80);
  }
  std::__cxx11::string::~string((string *)local_60);
  if (bVar2 == false) {
    poVar3 = std::operator<<(os,"Argument \"");
    poVar3 = std::operator<<(poVar3,(string *)&this->CurrentArgument);
    std::operator<<(poVar3,
                    "\" to --help-manual is not an available manual.  Use --help-manual-list to see all available manuals.\n"
                   );
  }
  std::__cxx11::string::~string((string *)&local_a0);
  return bVar2;
}

Assistant:

bool cmDocumentation::PrintHelpOneManual(std::ostream& os)
{
  std::string mname = this->CurrentArgument;
  std::string::size_type mlen = mname.length();
  if (mlen > 3 && mname[mlen - 3] == '(' && mname[mlen - 1] == ')') {
    mname = mname.substr(0, mlen - 3) + "." + mname[mlen - 2];
  }
  if (this->PrintFiles(os, cmStrCat("manual/", mname)) ||
      this->PrintFiles(os, cmStrCat("manual/", mname, ".[0-9]"))) {
    return true;
  }
  // Argument was not a manual.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-manual is not an available manual.  "
        "Use --help-manual-list to see all available manuals.\n";
  return false;
}